

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O1

void ga_zscal_patch_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,
                    DoubleComplex *alpha)

{
  Integer atype;
  Integer lo [2];
  long local_60;
  Integer local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  
  pnga_inquire_type(*g_a,&local_60);
  if (local_60 != 0x3ef) {
    pnga_error(" wrong types ",0);
  }
  local_48 = *ilo;
  local_40 = *jlo;
  local_58 = *ihi;
  local_50 = *jhi;
  pnga_scale_patch(*g_a,&local_48,&local_58,alpha);
  return;
}

Assistant:

void FATR ga_zscal_patch_(Integer *g_a, Integer *ilo, Integer *ihi, Integer *jlo, Integer *jhi, DoubleComplex *alpha)
{
    Integer atype;

    pnga_inquire_type(*g_a, &atype);
    if (atype != C_DCPL) pnga_error(" wrong types ", 0L);
    sga_scale_patch(*g_a, ilo, ihi, jlo, jhi, alpha);
}